

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MayEmitIfNonDefaultCheck
          (anon_unknown_0 *this,Printer *p,string_view prefix,FieldDescriptor *field,
          AnyInvocable<void_()> *emit_body,bool with_enclosing_braces_always)

{
  bool bVar1;
  long *plVar2;
  once_flag *poVar3;
  long lVar4;
  long alStack_258 [4];
  undefined1 auStack_238 [8];
  undefined8 uStack_230;
  anon_class_1_0_00000001 local_221;
  once_flag *local_220;
  once_flag *local_218;
  undefined8 local_210;
  int iStack_208;
  int iStack_204;
  once_flag *local_200 [2];
  undefined8 local_1f0;
  undefined1 auStack_1e8 [8];
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined8 uStack_1c8;
  FieldDescriptor *local_1c0;
  string *local_1b8;
  Printer *local_1b0;
  DescriptorPool *local_1a8;
  once_flag *local_1a0;
  once_flag *local_198;
  long local_190 [2];
  undefined1 local_180 [24];
  code *local_168;
  byte local_160;
  EnumDescriptor *local_158;
  ServiceDescriptor *local_150;
  undefined1 local_148 [88];
  char local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  FieldDescriptor *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_1c0 = (FieldDescriptor *)prefix._M_str;
  local_1a8 = (DescriptorPool *)prefix._M_len;
  uStack_230 = (undefined1 *)0xdbb63a;
  local_1b8 = (string *)this;
  local_1b0 = p;
  bVar1 = ShouldEmitNonDefaultCheck(local_1c0);
  if (bVar1) {
    uStack_230 = (undefined1 *)0xdbb65f;
    local_220 = (once_flag *)&local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"condition","");
    local_1a0 = (once_flag *)local_190;
    if (local_220 == (once_flag *)&local_210) {
      local_190[1]._0_4_ = iStack_208;
      local_190[1]._4_4_ = iStack_204;
    }
    else {
      local_1a0 = local_220;
    }
    local_198 = local_218;
    local_218 = (once_flag *)0x0;
    local_210._0_1_ = 0;
    uStack_230 = (undefined1 *)0xdbb746;
    local_220 = (once_flag *)&local_210;
    local_180._0_8_ = operator_new(0x20);
    *(string ***)local_180._0_8_ = &local_1b8;
    (((FieldDescriptor *)local_180._0_8_)->all_names_).payload_ = (char *)&local_1b0;
    ((FieldDescriptor *)local_180._0_8_)->file_ = (FileDescriptor *)&local_1c0;
    *(undefined1 *)&((FieldDescriptor *)local_180._0_8_)->type_once_ = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_180._8_8_ = (FileDescriptor **)0x0;
    local_180._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_160 = '\x01';
    local_158 = (EnumDescriptor *)local_148;
    local_150 = (ServiceDescriptor *)0x0;
    local_148[0] = '\0';
    local_148[0x10] = 0;
    uStack_230 = (undefined1 *)0xdbb7c8;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x120d342);
    local_f0 = '\0';
    uStack_230 = (undefined1 *)0xdbb7f6;
    local_1e0 = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"emit_body","");
    local_e8 = local_d8;
    if (local_1e0 == &local_1d0) {
      uStack_d0 = uStack_1c8;
    }
    else {
      local_e8 = local_1e0;
    }
    local_e0 = local_1d8;
    local_1d8 = 0;
    local_1d0 = 0;
    local_c0 = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    uStack_230 = (undefined1 *)0xdbb8aa;
    local_1e0 = &local_1d0;
    local_c8 = field;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x120d342);
    local_38 = 0;
    uStack_230 = (undefined1 *)0xdbb8d2;
    io::Printer::Emit((Printer *)this,&local_1a0,2,0x4b,
                      "\n          if ($condition$) {\n            $emit_body$;\n          }\n        "
                     );
    lVar4 = 0x170;
    do {
      if (*(char *)((long)&local_1a8 + lVar4) == '\x01') {
        uStack_230 = (undefined1 *)0xdbb8fc;
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (auStack_1e8 + lVar4));
      }
      if ((long *)((long)local_200 + lVar4) != *(long **)((long)&local_210 + lVar4)) {
        uStack_230 = (undefined1 *)0xdbb918;
        operator_delete(*(long **)((long)&local_210 + lVar4),*(long *)((long)local_200 + lVar4) + 1)
        ;
      }
      uStack_230 = (undefined1 *)0xdbb92b;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)&local_218 + lVar4)]._M_data)
                (&local_221,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(auStack_238 + lVar4));
      plVar2 = (long *)((long)alStack_258 + lVar4 + 0x10);
      *(undefined1 *)((long)&local_218 + lVar4) = 0xff;
      if (plVar2 != *(long **)((long)alStack_258 + lVar4)) {
        uStack_230 = (undefined1 *)0xdbb94b;
        operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar2 + 1);
      }
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != 0);
    if (local_1e0 != &local_1d0) {
      uStack_230 = (undefined1 *)0xdbb96b;
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
    if (local_220 == (once_flag *)&local_210) {
      return;
    }
    lVar4 = CONCAT71(local_210._1_7_,(undefined1)local_210);
    poVar3 = local_220;
  }
  else {
    if ((char)emit_body == '\0') {
      if (field->type_once_ == (once_flag *)0x0) {
        uStack_230 = &LAB_00dbbaf1;
        __assert_fail("this->invoker_ != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/functional/internal/any_invocable.h"
                      ,0x364,
                      "ReturnType absl::internal_any_invocable::Impl<void ()>::operator()(P...) [Sig = void ()]"
                     );
      }
      (*(code *)field->type_once_)(field);
      return;
    }
    uStack_230 = (undefined1 *)0xdbb6ba;
    local_200[0] = (once_flag *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"emit_body","");
    if (local_200[0] == (once_flag *)&local_1f0) {
      local_190[1] = (long)auStack_1e8;
      local_1a0 = (once_flag *)local_190;
    }
    else {
      local_1a0 = local_200[0];
    }
    local_190[0] = CONCAT71(local_1f0._1_7_,(undefined1)local_1f0);
    local_198 = local_200[1];
    local_200[1] = (once_flag *)0x0;
    local_1f0._0_1_ = 0;
    local_180._8_8_ = (FileDescriptor **)0x0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_180._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_160 = 1;
    local_150 = (ServiceDescriptor *)0x0;
    local_148[0] = '\0';
    local_148[0x10] = 0;
    uStack_230 = (undefined1 *)0xdbba0a;
    local_200[0] = (once_flag *)&local_1f0;
    local_180._0_8_ = field;
    local_158 = (EnumDescriptor *)local_148;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x120d342);
    local_f0 = '\0';
    uStack_230 = (undefined1 *)0xdbba32;
    io::Printer::Emit((Printer *)this,&local_1a0,1,0x6d,
                      "\n              {\n                //~ Force newline.\n                $emit_body$;\n              }\n            "
                     );
    if (local_f0 == '\x01') {
      uStack_230 = (undefined1 *)0xdbba49;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_148 + 0x18));
    }
    if (local_158 != (EnumDescriptor *)local_148) {
      uStack_230 = (undefined1 *)0xdbba6a;
      operator_delete(local_158,CONCAT71(local_148._1_7_,local_148[0]) + 1);
    }
    uStack_230 = (undefined1 *)0xdbba84;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_160]._M_data)
              (&local_221,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_180);
    local_160 = 0xff;
    if (local_1a0 != (once_flag *)local_190) {
      uStack_230 = (undefined1 *)0xdbbaa9;
      operator_delete(local_1a0,local_190[0] + 1);
    }
    if (local_200[0] == (once_flag *)&local_1f0) {
      return;
    }
    lVar4 = CONCAT71(local_1f0._1_7_,(undefined1)local_1f0);
    poVar3 = local_200[0];
  }
  uStack_230 = (undefined1 *)0xdbbac0;
  operator_delete(poVar3,lVar4 + 1);
  return;
}

Assistant:

void MayEmitIfNonDefaultCheck(io::Printer* p, absl::string_view prefix,
                              const FieldDescriptor* field,
                              absl::AnyInvocable<void()> emit_body,
                              bool with_enclosing_braces_always) {
  if (ShouldEmitNonDefaultCheck(field)) {
    p->Emit(
        {
            {"condition", [&] { EmitNonDefaultCheck(p, prefix, field); }},
            {"emit_body", [&] { emit_body(); }},
        },
        R"cc(
          if ($condition$) {
            $emit_body$;
          }
        )cc");
    return;
  }

  if (with_enclosing_braces_always) {
    // In repeated fields, the same variable name may be emitted multiple
    // times, hence the need for emitting braces even when the if condition is
    // not necessary, so that the code looks like:
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    p->Emit({{"emit_body", [&] { emit_body(); }}},
            R"cc(
              {
                //~ Force newline.
                $emit_body$;
              }
            )cc");
    return;
  }

  // If no enclosing braces need to be emitted, just emit the body directly.
  emit_body();
}